

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flush-recognizer.cpp
# Opt level: O3

void __thiscall mahjong::FlushRecognizer::check(FlushRecognizer *this,Meld *meld)

{
  int *piVar1;
  undefined8 uVar2;
  int iVar3;
  bool bVar4;
  Tile TVar5;
  long lVar6;
  
  bVar4 = Meld::isHonors(meld);
  if (bVar4) {
    this->has_honors = true;
  }
  else {
    TVar5 = Meld::frontTile(meld);
    (this->has_suit_tiles)._M_elems[(long)((int)TVar5 / 100) + -1] = true;
    bVar4 = Meld::isSequence(meld);
    lVar6 = (long)(((int)TVar5 / 10) % 10);
    iVar3 = *(int *)((long)&this->has_suit_tiles + lVar6 * 4 + -1);
    if (bVar4) {
      *(int *)((long)&this->has_suit_tiles + lVar6 * 4 + -1) = iVar3 + 1;
      uVar2 = *(undefined8 *)((this->number_count)._M_elems + lVar6);
      *(ulong *)((this->number_count)._M_elems + lVar6) =
           CONCAT44((int)((ulong)uVar2 >> 0x20) + 1,(int)uVar2 + 1);
    }
    else {
      *(int *)((long)&this->has_suit_tiles + lVar6 * 4 + -1) = iVar3 + 3;
      bVar4 = Meld::isQuad(meld);
      if (bVar4) {
        piVar1 = (int *)((long)&this->has_suit_tiles + lVar6 * 4 + -1);
        *piVar1 = *piVar1 + 1;
      }
    }
  }
  return;
}

Assistant:

void FlushRecognizer::check(const Meld& meld)
{
	if (meld.isHonors())
	{
		has_honors = true;
	}
	else
	{
		auto code = static_cast<int>(meld.frontTile());
		auto suit = code / 100;
		auto number = code / 10 % 10;

		has_suit_tiles[suit - 1] = true;

		if (meld.isSequence())
		{
			number_count[number - 1 + 0]++;
			number_count[number - 1 + 1]++;
			number_count[number - 1 + 2]++;
		}
		else
		{
			number_count[number - 1] += 3;
			if (meld.isQuad()) number_count[number - 1]++;
		}
	}
}